

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QRegularExpressionMatch __thiscall
QRegularExpressionMatchIterator::next(QRegularExpressionMatchIterator *this)

{
  long lVar1;
  bool bVar2;
  QRegularExpressionMatchIteratorPrivate *pQVar3;
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> in_RDI;
  long in_FS_OFFSET;
  QRegularExpressionMatch *in_stack_ffffffffffffff98;
  QRegularExpressionMatch *in_stack_ffffffffffffffa0;
  QRegularExpressionMatch *__new_val;
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> __obj;
  QRegularExpressionMatchPrivate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __obj.d.ptr = in_RDI.d.ptr;
  bVar2 = hasNext((QRegularExpressionMatchIterator *)0x1501ec);
  if (bVar2) {
    QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>::detach
              ((QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> *)
               in_stack_ffffffffffffffa0);
    pQVar3 = QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> *)
                        0x15024a);
    __new_val = &pQVar3->next;
    QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>::operator->
              ((QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> *)0x15025d);
    QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::constData
              ((QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> *)0x150269);
    QRegularExpressionMatchPrivate::nextMatch(in_stack_ffffffffffffffd8);
    std::exchange<QRegularExpressionMatch,QRegularExpressionMatch>
              ((QRegularExpressionMatch *)__obj.d.ptr,__new_val);
    QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x150294);
  }
  else {
    QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>::constData
              ((QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> *)0x150223);
    QRegularExpressionMatch::QRegularExpressionMatch
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)in_RDI.d.ptr;
}

Assistant:

QRegularExpressionMatch QRegularExpressionMatchIterator::next()
{
    if (!hasNext()) {
        qWarning("QRegularExpressionMatchIterator::next() called on an iterator already at end");
        return d.constData()->next;
    }

    d.detach();
    return std::exchange(d->next, d->next.d.constData()->nextMatch());
}